

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O1

_Bool XPKView_MainLoop(void)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int i;
  ulong uVar7;
  int win_h;
  int win_w;
  SDL_Rect dstrect;
  SDL_Event event;
  int local_8c;
  int local_88;
  uint local_84;
  ulong local_80;
  int local_78;
  int local_74;
  undefined8 local_70;
  int local_68 [5];
  int local_54;
  
  SDL_GetWindowSize(app.window,&local_88,&local_8c);
  uVar7 = 0;
  uVar5 = 0;
LAB_00102a82:
  while( true ) {
    iVar2 = SDL_PollEvent(local_68);
    if (iVar2 != 0) break;
    local_84 = uVar5 & 0xff;
    if ((uVar7 & 1) != 0) {
      local_84 = 1;
    }
    local_80 = uVar7;
    SDL_SetRenderDrawColor(app.renderer,0,0,0,0);
    SDL_RenderClear(app.renderer);
    if ((app.checkerboard_on == true) && (0x1f < local_8c)) {
      iVar2 = 0;
      do {
        if (0x1f < local_88) {
          iVar4 = 0;
          iVar6 = 0;
          do {
            local_70 = 0x2000000020;
            local_78 = iVar4;
            local_74 = iVar2 << 5;
            SDL_RenderCopy(app.renderer,app.checkerboard_tx,0,&local_78);
            iVar6 = iVar6 + 1;
            iVar3 = local_88 + 0x1f;
            if (-1 < local_88) {
              iVar3 = local_88;
            }
            iVar4 = iVar4 + 0x20;
          } while (iVar6 < iVar3 >> 5);
        }
        iVar2 = iVar2 + 1;
        iVar4 = local_8c + 0x1f;
        if (-1 < local_8c) {
          iVar4 = local_8c;
        }
      } while (iVar2 < iVar4 >> 5);
    }
    SDL_RenderCopy(app.renderer,app.xpkentry_tx,0);
    SDL_RenderPresent(app.renderer);
    uVar1 = SDL_Delay(1);
    uVar7 = local_80;
    uVar5 = local_84;
    if ((local_84 & 1) != 0) {
      return (_Bool)uVar1;
    }
  }
  if (local_68[0] != 0x100) goto code_r0x00102a9d;
  goto LAB_00102ace;
code_r0x00102a9d:
  if (local_68[0] != 0x300) goto LAB_00102a82;
  if (local_54 < 0x71) {
    if (local_54 == 0x62) {
      app.checkerboard_on = (_Bool)(app.checkerboard_on ^ 1);
    }
    else if (local_54 == 99) {
      XPKView_ToggleCentered();
    }
  }
  else {
    if (local_54 == 0x71) {
LAB_00102ace:
      uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      goto LAB_00102a82;
    }
    if (local_54 == 0x4000004f) {
      if ((int)((app.xpk)->n_entries - 1) <= app.which_entry) goto LAB_00102b11;
      app.which_entry = app.which_entry + 1;
    }
    else {
      if ((local_54 != 0x40000050) || (app.which_entry < 1)) goto LAB_00102b11;
      app.which_entry = app.which_entry + -1;
    }
    XPKView_LoadXPKEntry();
  }
LAB_00102b11:
  uVar7 = 0;
  goto LAB_00102a82;
}

Assistant:

static bool
XPKView_MainLoop(void)
{
	bool done = false;
	bool want_quit = false;
	SDL_Event event;

	int win_w, win_h;
	SDL_GetWindowSize(app.window, &win_w, &win_h);

	while (!done) {
		while (SDL_PollEvent(&event)) {
			switch (event.type) {
			case SDL_KEYDOWN:
				want_quit = XPKView_HandleKeyboard(event.key.keysym.sym);
				break;
			case SDL_QUIT:
				want_quit = true;
				break;
			default:
				; /* OK */
			}
		}

		if (want_quit) {
			done = true;
		}

		/* Now we can draw stuff. */
		SDL_SetRenderDrawColor(app.renderer, 0, 0, 0, 0);
		SDL_RenderClear(app.renderer);

		if (app.checkerboard_on) {
			for (int i = 0; i < win_h/32; i++) {
				for (int j = 0; j < win_w/32; j++) {
					SDL_Rect dstrect = (SDL_Rect){32*j, 32*i, 32, 32};
					SDL_RenderCopy(app.renderer, app.checkerboard_tx, NULL, &dstrect);
				}
			}
		}

		SDL_RenderCopy(app.renderer, app.xpkentry_tx, NULL, &app.entry_rect);

		SDL_RenderPresent(app.renderer);

		/* LOVE2D does this. It can dramatically reduce CPU usage. */
		SDL_Delay(1);
	}

	return true;
}